

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

bool __thiscall cfd::core::Psbt::IsFindTxInSignature(Psbt *this,uint32_t index,Pubkey *pubkey)

{
  long lVar1;
  uchar *key;
  size_type key_len;
  CfdException *this_00;
  bool bVar2;
  allocator local_b1;
  string local_b0;
  CfdSourceLocation local_90;
  int local_74;
  size_t sStack_70;
  int ret;
  size_t exist;
  ByteData local_58;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  wally_psbt *psbt_pointer;
  Pubkey *pubkey_local;
  uint32_t index_local;
  Psbt *this_local;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xabb,"IsFindTxInSignature");
  key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this->wally_psbt_pointer_;
  Pubkey::GetData(&local_58,pubkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,&local_58);
  ByteData::~ByteData(&local_58);
  sStack_70 = 0;
  lVar1 = *(long *)(key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10);
  key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  local_74 = wally_map_find((wally_map *)(lVar1 + 0x60 + (ulong)index * 0x110),key,key_len,
                            &stack0xffffffffffffff90);
  if (local_74 != 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0xac4;
    local_90.funcname = "IsFindTxInSignature";
    logger::warn<int&>(&local_90,"wally_map_find NG[{}]",&local_74);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_b0,"psbt find signature key error.",&local_b1);
    CfdException::CfdException(this_00,kCfdMemoryFullError,&local_b0);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar2 = sStack_70 != 0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return (bool)(-bVar2 & 1);
}

Assistant:

bool Psbt::IsFindTxInSignature(uint32_t index, const Pubkey &pubkey) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  auto key_vec = pubkey.GetData().GetBytes();
  size_t exist = 0;
  int ret = wally_map_find(
      &psbt_pointer->inputs[index].signatures, key_vec.data(), key_vec.size(),
      &exist);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_find NG[{}]", ret);
    throw CfdException(kCfdMemoryFullError, "psbt find signature key error.");
  }
  return (exist == 0) ? false : true;
}